

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ConcurrentDatabase::read_entry
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  int iVar3;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  pointer puVar4;
  bool bVar5;
  
  bVar5 = false;
  if ((this->mode != Append) && (this->mode != OverWrite)) {
    pDVar1 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar1 != (DatabaseInterface *)0x0) &&
       (iVar3 = (*pDVar1->_vptr_DatabaseInterface[3])(pDVar1,tag,hash,blob_size,blob,(ulong)flags),
       (char)iVar3 != '\0')) {
      return true;
    }
    puVar2 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->extra_readonly).
                  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar5 = puVar4 != puVar2, bVar5;
        puVar4 = puVar4 + 1) {
      pDVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar1 != (DatabaseInterface *)0x0) &&
         (iVar3 = (*pDVar1->_vptr_DatabaseInterface[3])(pDVar1,tag,hash,blob_size,blob,(ulong)flags)
         , (char)iVar3 != '\0')) {
        return bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if (mode == DatabaseMode::Append || mode == DatabaseMode::OverWrite)
			return false;

		if (readonly_interface && readonly_interface->read_entry(tag, hash, blob_size, blob, flags))
			return true;

		// There shouldn't be that many read-only databases to the point where we need to use hashmaps
		// to map hash/tag to the readonly database.
		for (auto &extra : extra_readonly)
			if (extra && extra->read_entry(tag, hash, blob_size, blob, flags))
				return true;

		return false;
	}